

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O3

bool __thiscall EventHandler::keyPressed(EventHandler *this,KeyEvent *arg)

{
  bool bVar1;
  int iVar2;
  ForceFeedback *pFVar3;
  long *plVar4;
  EWhichEffect eWhich;
  EWhichJoystick eWhich_00;
  EffectManager *this_00;
  JoystickManager *pJVar5;
  float dDeltaPercent;
  
  iVar2 = *(int *)(arg + 0x10);
  if (iVar2 < 200) {
    if (iVar2 == 1) {
      this->_pApplication->_bMustStop = true;
      return true;
    }
    if (iVar2 == 0x23) {
      Application::printHelp(this->_pApplication);
      return true;
    }
    if (iVar2 == 0x39) {
      pJVar5 = this->_pJoystickMgr;
      if ((long)pJVar5->_nCurrJoyInd < 0) {
        return true;
      }
      bVar1 = pJVar5->_bAutoCenter;
      pJVar5->_bAutoCenter = (bool)(bVar1 ^ 1);
      pFVar3 = (pJVar5->_vecFFDev).
               super__Vector_base<OIS::ForceFeedback_*,_std::allocator<OIS::ForceFeedback_*>_>.
               _M_impl.super__Vector_impl_data._M_start[pJVar5->_nCurrJoyInd];
      (**(code **)(*(long *)pFVar3 + 0x18))(pFVar3,bVar1 == false);
      return true;
    }
switchD_0010681e_caseD_ca:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Non mapped key: ",0x10);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,*(int *)(arg + 0x10));
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    return true;
  }
  switch(iVar2) {
  case 200:
    this_00 = this->_pEffectMgr;
    eWhich = eNext;
    break;
  case 0xc9:
    pJVar5 = this->_pJoystickMgr;
    dDeltaPercent = 5.0;
    goto LAB_001068e9;
  default:
    goto switchD_0010681e_caseD_ca;
  case 0xcb:
    EffectManager::selectEffect(this->_pEffectMgr,eNone);
    pJVar5 = this->_pJoystickMgr;
    eWhich_00 = ePrevious;
    goto LAB_001068bc;
  case 0xcd:
    EffectManager::selectEffect(this->_pEffectMgr,eNone);
    pJVar5 = this->_pJoystickMgr;
    eWhich_00 = eNext;
LAB_001068bc:
    JoystickManager::selectJoystick(pJVar5,eWhich_00);
    EffectManager::checkPlayableEffects(this->_pEffectMgr);
    return true;
  case 0xd0:
    this_00 = this->_pEffectMgr;
    eWhich = ePrevious;
    break;
  case 0xd1:
    pJVar5 = this->_pJoystickMgr;
    dDeltaPercent = -5.0;
LAB_001068e9:
    JoystickManager::changeMasterGain(pJVar5,dDeltaPercent);
    return true;
  }
  EffectManager::selectEffect(this_00,eWhich);
  return true;
}

Assistant:

bool EventHandler::keyPressed(const KeyEvent& arg)
{
	switch(arg.key)
	{
		// Quit.
		case KC_ESCAPE:
			_pApplication->stop();
			break;

		// Help.
		case KC_H:
			_pApplication->printHelp();
			break;

		// Change current joystick.
		case KC_RIGHT:
			_pEffectMgr->selectEffect(EffectManager::eNone);
			_pJoystickMgr->selectJoystick(JoystickManager::eNext);
			_pEffectMgr->checkPlayableEffects();
			break;
		case KC_LEFT:
			_pEffectMgr->selectEffect(EffectManager::eNone);
			_pJoystickMgr->selectJoystick(JoystickManager::ePrevious);
			_pEffectMgr->checkPlayableEffects();
			break;

		// Change current effect.
		case KC_UP:
			_pEffectMgr->selectEffect(EffectManager::eNext);
			break;
		case KC_DOWN:
			_pEffectMgr->selectEffect(EffectManager::ePrevious);
			break;

		// Change current master gain.
		case KC_PGUP:
			_pJoystickMgr->changeMasterGain(5.0); // Percent
			break;
		case KC_PGDOWN:
			_pJoystickMgr->changeMasterGain(-5.0); // Percent
			break;

		// Toggle auto-center mode.
		case KC_SPACE:
			_pJoystickMgr->changeAutoCenter();
			break;

		default:
			cout << "Non mapped key: " << arg.key << endl;
	}
	return true;
}